

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# other_functions.h
# Opt level: O2

node * createNode(size_t key)

{
  node *pnVar1;
  
  pnVar1 = (node *)malloc(0x20);
  LOCK();
  (pnVar1->markedKey).super___atomic_base<unsigned_long>._M_i = key;
  UNLOCK();
  LOCK();
  pnVar1->child[0]._M_b._M_p = (__pointer_type)0x8;
  UNLOCK();
  LOCK();
  pnVar1->child[1]._M_b._M_p = (__pointer_type)0x8;
  UNLOCK();
  LOCK();
  (pnVar1->readyToReplace)._M_base._M_i = false;
  UNLOCK();
  return pnVar1;
}

Assistant:

static struct node* createNode(size_t key)
{
    struct node* node = (struct node*) malloc(sizeof(struct node));
    node->markedKey = key;
    node->child[LC] = setNull(NULL);
    node->child[RC] = setNull(NULL);
    node->readyToReplace=false;
    return(node);
}